

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_cond(SyntaxAnalyze *this)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ExpressNode *this_00;
  uint uVar6;
  pointer pWVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  SyntaxAnalyze *in_RSI;
  SharedExNdPtr SVar9;
  string tmpName;
  SharedExNdPtr father;
  undefined1 local_f8 [32];
  ExpressNode *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  SyntaxAnalyze *local_c8;
  SharedExNdPtr local_c0;
  SharedExNdPtr local_b0;
  SharedExNdPtr local_a0;
  SharedExNdPtr local_90;
  string local_80;
  irGenerator *local_60;
  _Base_ptr local_58;
  string local_50;
  
  *(undefined8 *)this = 0;
  this->matched_index = 0;
  local_c8 = this;
  gm_and_exp((SyntaxAnalyze *)local_f8);
  uVar3 = local_f8._8_8_;
  uVar2 = local_f8._0_8_;
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
  *(undefined8 *)this = uVar2;
  this->matched_index = uVar3;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(in_RSI->matched_index + 1);
  pWVar7 = (in_RSI->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (((long)(in_RSI->word_list->
                        super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pWVar7 >> 4) *
                -0x5555555555555555);
  if (p_Var5 < _Var8._M_pi) {
    local_58 = (_Base_ptr)&this->matched_index;
    local_60 = &in_RSI->irGenerator;
    do {
      bVar4 = word::Word::match_token(pWVar7 + (long)p_Var5,OR);
      _Var8._M_pi = extraout_RDX;
      if (!bVar4) break;
      this_00 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(this_00);
      local_d8 = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                (&local_d0,this_00);
      local_d8->_operation = OR;
      match_one_word(in_RSI,OR);
      gm_and_exp((SyntaxAnalyze *)local_f8);
      uVar3 = local_f8._8_8_;
      uVar2 = local_f8._0_8_;
      local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f8._0_8_ = (element_type *)0x0;
      piVar1 = *(int **)this;
      if ((*piVar1 == 0) && (*(NodeType *)uVar2 == CNS)) {
        local_d8->_type = CNS;
        uVar6 = 1;
        if (piVar1[2] == 0) {
          uVar6 = (uint)(*(int *)(uVar2 + 8) != 0);
        }
        local_d8->_value = uVar6;
      }
      else {
        local_f8._0_8_ = local_f8 + 0x10;
        local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_f8[0x10] = 0;
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_50,local_60,Int);
        std::__cxx11::string::operator=((string *)local_f8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        this = local_c8;
        local_d8->_type = VAR;
        std::__cxx11::string::_M_assign((string *)&local_d8->_name);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_f8._0_8_,
                   (undefined1 *)
                   ((long)(NodeType *)local_f8._0_8_ + (long)(_func_int ***)local_f8._8_8_));
        local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = *(element_type **)this;
        local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
        if ((element_type *)
            local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_90.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_name)._M_dataplus._M_p =
                 *(int *)&(((element_type *)
                           local_90.
                           super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_name)._M_dataplus._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_90.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_name)._M_dataplus._M_p =
                 *(int *)&(((element_type *)
                           local_90.
                           super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_name)._M_dataplus._M_p + 1;
          }
        }
        local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)uVar2;
        local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(uVar3 + 8) = *(_Atomic_word *)(uVar3 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(uVar3 + 8) = *(_Atomic_word *)(uVar3 + 8) + 1;
          }
        }
        hp_gn_binary_mir(in_RSI,&local_80,&local_90,&local_a0,Or);
        if (local_a0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)
            local_90.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_f8._0_8_ != (element_type *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,CONCAT71(local_f8._17_7_,local_f8[0x10]) + 1);
        }
      }
      local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)this;
      local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
      if (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      express::ExpressNode::addChild(local_d8,&local_b0);
      if (local_b0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar2;
      local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(uVar3 + 8) = *(_Atomic_word *)(uVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(uVar3 + 8) = *(_Atomic_word *)(uVar3 + 8) + 1;
        }
      }
      express::ExpressNode::addChild(local_d8,&local_c0);
      if (local_c0.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      *(ExpressNode **)this = local_d8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_58,&local_d0);
      if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
      }
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(in_RSI->matched_index + 1);
      pWVar7 = (in_RSI->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((long)(in_RSI->word_list->
                            super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar7 >> 4) *
                    -0x5555555555555555);
    } while (p_Var5 < _Var8._M_pi);
  }
  SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar9.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_cond() {
  SharedExNdPtr first;
  first = gm_and_exp();

  while (try_word(1, Token::OR)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    father->_operation = OperationType::OR;

    match_one_word(Token::OR);
    op = Op::Or;

    second = gm_and_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      father->_value = first->_value || second->_value;
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }
    father->addChild(first);
    father->addChild(second);
    first = father;
  }

  return first;
}